

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
::_positive_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  ulong uVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  node_ptr next;
  _Hash_node_base *p_Var4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  pointer p;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint uVar10;
  __hash_code __code;
  Index local_30;
  uint local_2c;
  
  uVar10 = columnIndex + 1;
  uVar1 = (this->super_type).super_type.map_._M_h._M_bucket_count;
  uVar7 = (ulong)uVar10 % uVar1;
  p_Var8 = (this->super_type).super_type.map_._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != uVar10)) {
    while (p_Var8 = p_Var4, p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var4[1]._M_nxt == uVar10)) goto LAB_00154dfd;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00154dfd:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var9->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    uVar10 = *(uint *)((long)&p_Var4[1]._M_nxt + 4);
  }
  local_30 = columnIndex;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this[2].super_type.indexToBar_._M_h._M_rehash_policy._M_next_resize,&local_30);
  local_2c = uVar10;
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)(this + 2),&local_2c);
  p = (pointer)&pmVar5->column_;
  do {
    p = (pointer)(p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p == (pointer)&pmVar5->column_) goto LAB_00154e7b;
    if (p == (pointer)0x0) {
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (p->rowIndex_ != *pmVar6);
  plVar2 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar3 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar3->next_ = plVar2;
  plVar2->prev_ = plVar3;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
  ::destroy(&pmVar5->entryPool_->entryPool_,p);
LAB_00154e7b:
  _swap_at_index(this,columnIndex);
  _positive_negative_transpose(this,columnIndex);
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_negative_vine_swap(Index columnIndex) 
{
  _matrix()->mirrorMatrixU_.zero_entry(columnIndex, _get_row_id_from_position(columnIndex + 1));

  _swap_at_index(columnIndex);
  _positive_negative_transpose(columnIndex);

  return true;
}